

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_Utf8ValidationTest_::
ReadArbitraryBytes<proto2_unittest::TestAllTypes>::TestBody
          (ReadArbitraryBytes<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  TypedExpectation<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  string *lhs;
  string *rhs;
  char *message;
  string *in_R8;
  string_view value;
  AssertHelper local_248;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_220;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_208;
  Matcher<absl::lts_20250127::LogSeverity> local_1f0;
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1d8;
  undefined1 local_188 [8];
  ScopedMockLog log;
  OneBytes output;
  char *pcStack_70;
  undefined1 local_50 [8];
  OneBytes input;
  string wire_buffer;
  ReadArbitraryBytes<proto2_unittest::TestAllTypes> *this_local;
  
  std::__cxx11::string::string((string *)&input.field_0._impl_.data_);
  proto2_unittest::OneBytes::OneBytes((OneBytes *)local_50);
  output.field_0._impl_.data_.tagged_ptr_.ptr_ =
       (ArenaStringPtr)Utf8ValidationTest<proto2_unittest::TestAllTypes>::kInvalidUTF8String._M_len;
  pcStack_70 = Utf8ValidationTest<proto2_unittest::TestAllTypes>::kInvalidUTF8String._M_str;
  value._M_str = local_50;
  value._M_len = (size_t)pcStack_70;
  WriteMessage<proto2_unittest::OneBytes>
            ((internal *)output.field_0._impl_.data_.tagged_ptr_.ptr_,value,
             (OneBytes *)&input.field_0._impl_.data_,in_R8);
  proto2_unittest::OneBytes::OneBytes((OneBytes *)&log.is_capturing_logs_);
  absl::lts_20250127::ScopedMockLog::ScopedMockLog((ScopedMockLog *)local_188,kDisallowUnexpected);
  testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher(&local_1f0,kError);
  testing::Matcher<std::__cxx11::string_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::__cxx11::string_const&> *)&local_208,(AnythingMatcher *)&testing::_);
  testing::Matcher<std::__cxx11::string_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::__cxx11::string_const&> *)&local_220,(AnythingMatcher *)&testing::_);
  absl::lts_20250127::ScopedMockLog::gmock_Log
            (&local_1d8,(ScopedMockLog *)local_188,&local_1f0,&local_208,&local_220);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&local_1d8,
                         (WithoutMatchers *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),(void *)0x0);
  this_01 = testing::internal::
            MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                       ,0x65f,"log","Log(absl::LogSeverity::kError, testing::_, testing::_)");
  testing::internal::
  TypedExpectation<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(this_01,0);
  testing::internal::
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_1d8);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_220);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_208);
  testing::Matcher<absl::lts_20250127::LogSeverity>::~Matcher(&local_1f0);
  absl::lts_20250127::ScopedMockLog::StartCapturingLogs((ScopedMockLog *)local_188);
  ReadMessage<proto2_unittest::OneBytes>
            ((string *)&input.field_0._impl_.data_,(OneBytes *)&log.is_capturing_logs_);
  absl::lts_20250127::ScopedMockLog::~ScopedMockLog((ScopedMockLog *)local_188);
  lhs = proto2_unittest::OneBytes::data_abi_cxx11_((OneBytes *)local_50);
  rhs = proto2_unittest::OneBytes::data_abi_cxx11_((OneBytes *)&log.is_capturing_logs_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_238,"input.data()","output.data()",lhs,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x664,message);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  proto2_unittest::OneBytes::~OneBytes((OneBytes *)&log.is_capturing_logs_);
  proto2_unittest::OneBytes::~OneBytes((OneBytes *)local_50);
  std::__cxx11::string::~string((string *)&input.field_0._impl_.data_);
  return;
}

Assistant:

TYPED_TEST_P(Utf8ValidationTest, ReadArbitraryBytes) {
  std::string wire_buffer;
  typename TestFixture::OneBytes input;
  WriteMessage(this->kInvalidUTF8String, &input, &wire_buffer);
  typename TestFixture::OneBytes output;
  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_, testing::_))
        .Times(0);
    log.StartCapturingLogs();
    ReadMessage(wire_buffer, &output);
  }
  EXPECT_EQ(input.data(), output.data());
}